

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O0

void find_path(PATHFIND_DATA *path,ROOM_INDEX_DATA *goal)

{
  PATHFIND_DATA *pPVar1;
  ROOM_INDEX_DATA *in_RSI;
  PATHFIND_DATA *in_RDI;
  int i_3;
  PATHFIND_DATA *next_path;
  int i_2;
  int i_1;
  int i;
  bool found;
  int local_2c;
  int local_20;
  int local_1c;
  int iVar2;
  uint3 in_stack_ffffffffffffffec;
  uint uVar3;
  
  in_RDI->evaluated = true;
  iterations = iterations + 1;
  if (in_RDI->room == in_RSI) {
    if ((best_path == (PATHFIND_DATA *)0x0) || (in_RDI->steps < best_path->steps)) {
      best_path = in_RDI;
    }
  }
  else {
    uVar3 = (uint)in_stack_ffffffffffffffec;
    for (iVar2 = 0; iVar2 < 6; iVar2 = iVar2 + 1) {
      if (((best_path != (PATHFIND_DATA *)0x0) && (best_path->steps < 2)) ||
         ((((in_RDI->room->exit[iVar2] != (EXIT_DATA *)0x0 &&
            (((in_RDI->room->exit[iVar2]->u1).to_room != (ROOM_INDEX_DATA *)0x0 &&
             (((in_RDI->room->exit[iVar2]->u1).to_room)->area == in_RSI->area)))) &&
           ((((in_RDI->room->exit[iVar2]->u1).to_room)->path == (PATHFIND_DATA *)0x0 ||
            ((in_RDI->steps + 1 < ((in_RDI->room->exit[iVar2]->u1).to_room)->path->steps ||
             ((((in_RDI->room->exit[iVar2]->u1).to_room)->path->evaluated & 1U) == 0)))))) &&
          ((((in_RDI->room->exit[iVar2]->u1).to_room)->path == (PATHFIND_DATA *)0x0 ||
           ((in_RDI->steps + 1 <= ((in_RDI->room->exit[iVar2]->u1).to_room)->path->steps ||
            ((((in_RDI->room->exit[iVar2]->u1).to_room)->path->evaluated & 1U) != 0)))))))) {
        uVar3 = CONCAT13(1,(int3)uVar3);
      }
    }
    if ((char)(uVar3 >> 0x18) == '\0') {
      for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
        in_RDI->dir_to[local_1c] = (PATHFIND_DATA *)0x0;
      }
    }
    else {
      for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
        if (((((in_RDI->room->exit[local_20] != (EXIT_DATA *)0x0) &&
              ((in_RDI->room->exit[local_20]->u1).to_room != (ROOM_INDEX_DATA *)0x0)) &&
             (((in_RDI->room->exit[local_20]->u1).to_room)->area == in_RSI->area)) &&
            (((((in_RDI->room->exit[local_20]->u1).to_room)->path == (PATHFIND_DATA *)0x0 ||
              (in_RDI->steps + 1 < ((in_RDI->room->exit[local_20]->u1).to_room)->path->steps)) ||
             ((((in_RDI->room->exit[local_20]->u1).to_room)->path->evaluated & 1U) == 0)))) &&
           (((((in_RDI->room->exit[local_20]->u1).to_room)->path == (PATHFIND_DATA *)0x0 ||
             (in_RDI->steps + 1 <= ((in_RDI->room->exit[local_20]->u1).to_room)->path->steps)) ||
            ((((in_RDI->room->exit[local_20]->u1).to_room)->path->evaluated & 1U) != 0)))) {
          pPVar1 = new_path_data();
          pPVar1->room = (ROOM_INDEX_DATA *)in_RDI->room->exit[local_20]->u1;
          pPVar1->dir_from = local_20;
          pPVar1->steps = in_RDI->steps + 1;
          pPVar1->prev = in_RDI;
          in_RDI->dir_to[local_20] = pPVar1;
          ((in_RDI->room->exit[local_20]->u1).to_room)->path = pPVar1;
        }
      }
      for (local_2c = 0; local_2c < 6; local_2c = local_2c + 1) {
        if ((((in_RDI->room->exit[local_2c] != (EXIT_DATA *)0x0) &&
             (in_RDI->dir_to[local_2c] != (PATHFIND_DATA *)0x0)) &&
            ((in_RDI->room->exit[local_2c]->u1).to_room != (ROOM_INDEX_DATA *)0x0)) &&
           ((((in_RDI->room->exit[local_2c]->u1).to_room)->area == in_RSI->area &&
            ((((in_RDI->room->exit[local_2c]->u1).to_room)->path->evaluated & 1U) == 0)))) {
          find_path((PATHFIND_DATA *)in_RSI,(ROOM_INDEX_DATA *)CONCAT44(uVar3,iVar2));
        }
      }
    }
  }
  return;
}

Assistant:

void find_path(PATHFIND_DATA *path, ROOM_INDEX_DATA *goal)
{
	path->evaluated = true;
	iterations++;

	if (path->room == goal)
	{
		if (!best_path || best_path->steps > path->steps)
			best_path = path;

		return;
	}

	auto found = false;
	for (auto i = 0; i < 6; i++)
	{
		if ((best_path && best_path->steps < 2)
			|| (path->room->exit[i] 
				&& path->room->exit[i]->u1.to_room
				&& path->room->exit[i]->u1.to_room->area == goal->area
				&& !(path->room->exit[i]->u1.to_room->path
					&& path->room->exit[i]->u1.to_room->path->steps <= path->steps + 1
					&& path->room->exit[i]->u1.to_room->path->evaluated)
				&& !(path->room->exit[i]->u1.to_room->path
					&& path->room->exit[i]->u1.to_room->path->steps < path->steps + 1
					&& !path->room->exit[i]->u1.to_room->path->evaluated)))
		{
			found = true;
		}
	}

	if (!found)
	{
		for (auto i = 0; i < 6; i++)
		{
			path->dir_to[i] = nullptr;
		}

		return;
	}

	for (auto i = 0; i < 6; i++)
	{
		if (!path->room->exit[i]
			|| !path->room->exit[i]->u1.to_room
			|| path->room->exit[i]->u1.to_room->area != goal->area
			|| (path->room->exit[i]->u1.to_room->path 
				&& path->room->exit[i]->u1.to_room->path->steps <= path->steps + 1 
				&& path->room->exit[i]->u1.to_room->path->evaluated)
			|| (path->room->exit[i]->u1.to_room->path
				&& path->room->exit[i]->u1.to_room->path->steps < path->steps + 1
				&& !path->room->exit[i]->u1.to_room->path->evaluated))
		{
			continue;
		}

		auto next_path = new_path_data();
		next_path->room = path->room->exit[i]->u1.to_room;
		next_path->dir_from = i;
		next_path->steps = path->steps + 1;
		next_path->prev = path;

		path->dir_to[i] = next_path;
		path->room->exit[i]->u1.to_room->path = next_path;
	}

	for (auto i = 0; i < 6; i++)
	{
		if (!path->room->exit[i]
			|| !path->dir_to[i]
			|| !path->room->exit[i]->u1.to_room
			|| path->room->exit[i]->u1.to_room->area != goal->area
			|| path->room->exit[i]->u1.to_room->path->evaluated)
		{
			continue;
		}

		find_path(path->dir_to[i], goal);
	}
}